

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::upnp_fill_s
               (Vector4d *quaternion,Matrix<double,_10,_1,_0,_10,_1> *s)

{
  double dVar1;
  
  dVar1 = (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[0];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[0] =
       dVar1 * dVar1;
  dVar1 = (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[1];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[1] =
       dVar1 * dVar1;
  dVar1 = (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[2];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[2] =
       dVar1 * dVar1;
  dVar1 = (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
          m_data.array[3];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[3] =
       dVar1 * dVar1;
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[4] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[0] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[1];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[5] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[0] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[2];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[6] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[0] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[3];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[7] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[1] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[2];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[8] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[1] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[3];
  (s->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).m_storage.m_data.array[9] =
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[2] *
       (quaternion->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
       array[3];
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_fill_s(
    const Eigen::Vector4d & quaternion,
    Eigen::Matrix<double,10,1> & s )
{
  s[0] = quaternion[0] * quaternion[0];
  s[1] = quaternion[1] * quaternion[1];
  s[2] = quaternion[2] * quaternion[2];
  s[3] = quaternion[3] * quaternion[3];
  s[4] = quaternion[0] * quaternion[1];
  s[5] = quaternion[0] * quaternion[2];
  s[6] = quaternion[0] * quaternion[3];
  s[7] = quaternion[1] * quaternion[2];
  s[8] = quaternion[1] * quaternion[3];
  s[9] = quaternion[2] * quaternion[3];
}